

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

InterpFilter
get_ref_filter_type(MB_MODE_INFO *ref_mbmi,MACROBLOCKD *xd,int dir,MV_REFERENCE_FRAME ref_frame)

{
  InterpFilter IVar1;
  char in_CL;
  uint in_EDX;
  long in_RDI;
  
  if ((*(char *)(in_RDI + 0x10) == in_CL) || (*(char *)(in_RDI + 0x11) == in_CL)) {
    IVar1 = av1_extract_interp_filter(*(int_interpfilters *)(in_RDI + 0x14),in_EDX & 1);
  }
  else {
    IVar1 = BILINEAR;
  }
  return IVar1;
}

Assistant:

static InterpFilter get_ref_filter_type(const MB_MODE_INFO *ref_mbmi,
                                        const MACROBLOCKD *xd, int dir,
                                        MV_REFERENCE_FRAME ref_frame) {
  (void)xd;

  return ((ref_mbmi->ref_frame[0] == ref_frame ||
           ref_mbmi->ref_frame[1] == ref_frame)
              ? av1_extract_interp_filter(ref_mbmi->interp_filters, dir & 0x01)
              : SWITCHABLE_FILTERS);
}